

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001d2470 = 0x2e2e2e2e2e2e2e;
    uRam00000000001d2477._0_1_ = '.';
    uRam00000000001d2477._1_1_ = '.';
    uRam00000000001d2477._2_1_ = '.';
    uRam00000000001d2477._3_1_ = '.';
    uRam00000000001d2477._4_1_ = '.';
    uRam00000000001d2477._5_1_ = '.';
    uRam00000000001d2477._6_1_ = '.';
    uRam00000000001d2477._7_1_ = '.';
    DAT_001d2460 = '.';
    DAT_001d2460_1._0_1_ = '.';
    DAT_001d2460_1._1_1_ = '.';
    DAT_001d2460_1._2_1_ = '.';
    DAT_001d2460_1._3_1_ = '.';
    DAT_001d2460_1._4_1_ = '.';
    DAT_001d2460_1._5_1_ = '.';
    DAT_001d2460_1._6_1_ = '.';
    uRam00000000001d2468 = 0x2e2e2e2e2e2e2e;
    DAT_001d246f = 0x2e;
    DAT_001d2450 = '.';
    DAT_001d2450_1._0_1_ = '.';
    DAT_001d2450_1._1_1_ = '.';
    DAT_001d2450_1._2_1_ = '.';
    DAT_001d2450_1._3_1_ = '.';
    DAT_001d2450_1._4_1_ = '.';
    DAT_001d2450_1._5_1_ = '.';
    DAT_001d2450_1._6_1_ = '.';
    uRam00000000001d2458._0_1_ = '.';
    uRam00000000001d2458._1_1_ = '.';
    uRam00000000001d2458._2_1_ = '.';
    uRam00000000001d2458._3_1_ = '.';
    uRam00000000001d2458._4_1_ = '.';
    uRam00000000001d2458._5_1_ = '.';
    uRam00000000001d2458._6_1_ = '.';
    uRam00000000001d2458._7_1_ = '.';
    DAT_001d2440 = '.';
    DAT_001d2440_1._0_1_ = '.';
    DAT_001d2440_1._1_1_ = '.';
    DAT_001d2440_1._2_1_ = '.';
    DAT_001d2440_1._3_1_ = '.';
    DAT_001d2440_1._4_1_ = '.';
    DAT_001d2440_1._5_1_ = '.';
    DAT_001d2440_1._6_1_ = '.';
    uRam00000000001d2448._0_1_ = '.';
    uRam00000000001d2448._1_1_ = '.';
    uRam00000000001d2448._2_1_ = '.';
    uRam00000000001d2448._3_1_ = '.';
    uRam00000000001d2448._4_1_ = '.';
    uRam00000000001d2448._5_1_ = '.';
    uRam00000000001d2448._6_1_ = '.';
    uRam00000000001d2448._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001d2438._0_1_ = '.';
    uRam00000000001d2438._1_1_ = '.';
    uRam00000000001d2438._2_1_ = '.';
    uRam00000000001d2438._3_1_ = '.';
    uRam00000000001d2438._4_1_ = '.';
    uRam00000000001d2438._5_1_ = '.';
    uRam00000000001d2438._6_1_ = '.';
    uRam00000000001d2438._7_1_ = '.';
    DAT_001d247f = 0;
  }
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}